

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  Curl_easy *data;
  char **ppcVar1;
  connectdata *pcVar2;
  undefined1 uVar3;
  CURLcode CVar4;
  char *pcVar5;
  uchar *puVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined7 in_register_00000031;
  char **ppcVar10;
  char *pcVar11;
  char *pcVar12;
  char *response;
  ulong local_70;
  connectdata *local_68;
  long local_60;
  char *local_58;
  char *local_50;
  uchar *local_48;
  uchar *local_40;
  size_t len;
  
  data = conn->data;
  iVar9 = (int)CONCAT71(in_register_00000031,proxy);
  uVar7 = (ulong)(uint)(iVar9 << 5) | 0x4bd8;
  ppcVar1 = &conn->user;
  ppcVar10 = &conn->passwd;
  lVar8 = 0x450;
  if (iVar9 != 0) {
    lVar8 = 0x438;
    ppcVar10 = &(conn->http_proxy).passwd;
    ppcVar1 = &(conn->http_proxy).user;
  }
  pcVar11 = *ppcVar10;
  pcVar12 = *ppcVar1;
  local_48 = request;
  local_40 = uripath;
  (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar8 + -0x20));
  puVar6 = local_40;
  pcVar5 = (conn->chunk).hexbuffer + lVar8 + -0x20;
  pcVar5[0] = '\0';
  pcVar5[1] = '\0';
  pcVar5[2] = '\0';
  pcVar5[3] = '\0';
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  if (pcVar12 == (char *)0x0) {
    pcVar12 = "";
  }
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  uVar3 = 0;
  if (*(long *)((long)((data->state).tempwrite + 4) + (ulong)(uint)(iVar9 << 6) + 8) != 0) {
    local_70 = uVar7;
    local_68 = conn;
    local_60 = lVar8;
    local_58 = pcVar12;
    local_50 = pcVar11;
    if ((*(char *)((long)data->sockets + (uVar7 - 0x66)) == '\x01') &&
       (pcVar5 = strchr((char *)local_40,0x3f), pcVar5 != (char *)0x0)) {
      puVar6 = (uchar *)curl_maprintf("%.*s",(long)pcVar5 - (long)puVar6,puVar6);
    }
    else {
      puVar6 = (uchar *)(*Curl_cstrdup)((char *)puVar6);
    }
    if (puVar6 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = Curl_auth_create_digest_http_message
                      (data,local_58,local_50,local_48,puVar6,
                       (digestdata *)
                       ((long)((data->state).tempwrite + 4) + (ulong)(uint)(iVar9 << 6) + 8),
                       &response,&len);
    (*Curl_cfree)(puVar6);
    uVar7 = local_70;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pcVar5 = "";
    if (proxy) {
      pcVar5 = "Proxy-";
    }
    pcVar5 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar5,response);
    lVar8 = local_60;
    pcVar2 = local_68;
    *(char **)((local_68->chunk).hexbuffer + local_60 + -0x20) = pcVar5;
    (*Curl_cfree)(response);
    uVar3 = 1;
    if (*(long *)((pcVar2->chunk).hexbuffer + lVar8 + -0x20) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *(undefined1 *)((long)data->sockets + (uVar7 - 0x68)) = uVar3;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
    digest = &data->state.proxydigest;
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    authp = &data->state.authproxy;
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      path = (unsigned char *) aprintf("%.*s", urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}